

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_posix.cpp
# Opt level: O3

int __thiscall pstore::file::file_handle::rename(file_handle *this,char *__old,char *__new)

{
  pointer pcVar1;
  char *__to;
  _Alloc_hider __from;
  int iVar2;
  ulong uVar3;
  uint *puVar4;
  int iVar5;
  errno_erc erc;
  ostringstream message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  ostringstream local_1a8 [376];
  
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  pcVar1 = (this->path_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e8,pcVar1,pcVar1 + (this->path_)._M_string_length);
  __from._M_p = local_1e8._M_dataplus._M_p;
  __to = *(char **)__old;
  uVar3 = syscall(0x13c,0xffffff9c,local_1e8._M_dataplus._M_p,0xffffff9c,__to,1);
  puVar4 = (uint *)__errno_location();
  if ((long)uVar3 < 0) {
    uVar3 = (ulong)*puVar4;
    if ((uVar3 < 0x27) && ((0x4002400000U >> (uVar3 & 0x3f) & 1) != 0)) {
      iVar2 = linkat(-100,__from._M_p,-100,__to,0);
      if (iVar2 < 0) {
        uVar3 = (ulong)*puVar4;
        if ((uVar3 < 0x27) && ((0x4002400002U >> (uVar3 & 0x3f) & 1) != 0)) {
          iVar5 = 0;
          iVar2 = faccessat(-100,__to,0,0x100);
          if (-1 < iVar2) goto LAB_00121739;
          uVar3 = (ulong)*puVar4;
          if (*puVar4 == 2) {
            iVar2 = renameat(-100,__from._M_p,-100,__to);
            if (-1 < iVar2) goto LAB_00121727;
            uVar3 = (ulong)*puVar4;
          }
        }
      }
      else {
        iVar2 = unlinkat(-100,__from._M_p,0);
        if (-1 < iVar2) goto LAB_00121727;
        uVar3 = (ulong)*puVar4;
        unlinkat(-100,__to,0);
      }
    }
    erc.err_ = (int)uVar3;
    if (0 < erc.err_) {
      if (erc.err_ != 0x11) {
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Unable to rename ",0x11);
        local_1c8._M_string_length._0_2_ = 0x22;
        local_1c8._M_dataplus._M_p = (pointer)&local_1e8;
        std::__detail::operator<<
                  ((basic_ostream<char,_std::char_traits<char>_> *)local_1a8,
                   (_Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
                    *)&local_1c8);
        std::__cxx11::stringbuf::str();
        raise<pstore::errno_erc,std::__cxx11::string>(erc,&local_1c8);
      }
      iVar5 = 0;
      goto LAB_00121739;
    }
  }
LAB_00121727:
  iVar5 = (int)CONCAT71((int7)(uVar3 >> 8),1);
  std::__cxx11::string::_M_assign((string *)&this->path_);
LAB_00121739:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  return iVar5;
}

Assistant:

bool file_handle::rename (std::string const & new_name) {
            bool result = true;
            auto const & path = this->path ();
            int err = rename_noreplace (path.c_str (), new_name.c_str ());
            if (err >= 0) {
                path_ = new_name;
            } else {
                err = -err;
                if (err == EEXIST) {
                    result = false;
                } else {
                    std::ostringstream message;
                    message << "Unable to rename " << pstore::quoted (path);
                    raise (errno_erc{err}, message.str ());
                }
            }
            return result;
        }